

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::NonUniformTileConfigTestLarge_NonUniformTileConfigTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::NonUniformTileConfigTestLarge_NonUniformTileConfigTest_Test>
             *this)

{
  Test *this_00;
  ParamType *pPVar1;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,(anonymous_namespace)::nonUniformTileConfigParam,aom_rc_mode>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x610);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010161e0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__CodecTestWith3Params_01016220;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>
           ::GetParam();
  this_00[2]._vptr_Test =
       (_func_int **)
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
       ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  *(undefined1 *)
   &this_00[2].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  this_00[0x3c]._vptr_Test = (_func_int **)(this_00 + 0x3d);
  this_00[0x3c].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined1 *)&this_00[0x3d]._vptr_Test = 0;
  this_00[0x3e]._vptr_Test = (_func_int **)0x0;
  this_00[0x3e].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined4 *)&this_00[0x3f]._vptr_Test = 0;
  *(undefined4 *)((long)&this_00[3]._vptr_Test + 4) = 1;
  this_00->_vptr_Test = (_func_int **)&PTR__NonUniformTileConfigTestLarge_010160c0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__NonUniformTileConfigTestLarge_01016118;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__NonUniformTileConfigTestLarge_01016138;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>
           ::GetParam();
  *(TestMode *)((long)&this_00[0x3f]._vptr_Test + 4) =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
       ).
       super__Tuple_impl<1UL,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
       .super__Head_base<1UL,_libaom_test::TestMode,_false>._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>
           ::GetParam();
  memcpy(&this_00[0x3f].gtest_flag_saver_,
         &(pPVar1->
          super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
          ).
          super__Tuple_impl<1UL,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
          .super__Tuple_impl<2UL,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>.
          super__Head_base<2UL,_(anonymous_namespace)::nonUniformTileConfigParam,_false>,0x20c);
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>
           ::GetParam();
  *(aom_rc_mode *)
   &this_00[0x60].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
       ).
       super__Tuple_impl<1UL,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
       .super__Tuple_impl<2UL,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>.
       super__Tuple_impl<3UL,_aom_rc_mode>.super__Head_base<3UL,_aom_rc_mode,_false>._M_head_impl;
  *(undefined1 *)((long)&this_00[0x60]._vptr_Test + 4) = 0;
  this_00->_vptr_Test = (_func_int **)&PTR__NonUniformTileConfigTestLarge_01015ef0;
  this_00[1]._vptr_Test =
       (_func_int **)&PTR__NonUniformTileConfigTestLarge_NonUniformTileConfigTest_Test_01015f48;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__NonUniformTileConfigTestLarge_NonUniformTileConfigTest_Test_01015f68;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }